

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

TimeScaleDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TimeScaleDirectiveSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,Token *args_3)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  TokenKind TVar17;
  undefined1 uVar18;
  NumericTokenFlags NVar19;
  uint32_t uVar20;
  TimeScaleDirectiveSyntax *pTVar21;
  
  pTVar21 = (TimeScaleDirectiveSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((TimeScaleDirectiveSyntax *)this->endPtr < pTVar21 + 1) {
    pTVar21 = (TimeScaleDirectiveSyntax *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(pTVar21 + 1);
  }
  TVar5 = args->kind;
  uVar6 = args->field_0x2;
  NVar7.raw = (args->numFlags).raw;
  uVar8 = args->rawLen;
  pIVar1 = args->info;
  TVar9 = args_1->kind;
  uVar10 = args_1->field_0x2;
  NVar11.raw = (args_1->numFlags).raw;
  uVar12 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar13 = args_2->kind;
  uVar14 = args_2->field_0x2;
  NVar15.raw = (args_2->numFlags).raw;
  uVar16 = args_2->rawLen;
  pIVar3 = args_2->info;
  TVar17 = args_3->kind;
  uVar18 = args_3->field_0x2;
  NVar19.raw = (args_3->numFlags).raw;
  uVar20 = args_3->rawLen;
  pIVar4 = args_3->info;
  (pTVar21->super_DirectiveSyntax).super_SyntaxNode.kind = TimeScaleDirective;
  (pTVar21->super_DirectiveSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pTVar21->super_DirectiveSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pTVar21->super_DirectiveSyntax).directive.kind = TVar5;
  (pTVar21->super_DirectiveSyntax).directive.field_0x2 = uVar6;
  (pTVar21->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar7.raw;
  (pTVar21->super_DirectiveSyntax).directive.rawLen = uVar8;
  (pTVar21->super_DirectiveSyntax).directive.info = pIVar1;
  (pTVar21->timeUnit).kind = TVar9;
  (pTVar21->timeUnit).field_0x2 = uVar10;
  (pTVar21->timeUnit).numFlags = (NumericTokenFlags)NVar11.raw;
  (pTVar21->timeUnit).rawLen = uVar12;
  (pTVar21->timeUnit).info = pIVar2;
  (pTVar21->slash).kind = TVar13;
  (pTVar21->slash).field_0x2 = uVar14;
  (pTVar21->slash).numFlags = (NumericTokenFlags)NVar15.raw;
  (pTVar21->slash).rawLen = uVar16;
  (pTVar21->slash).info = pIVar3;
  (pTVar21->timePrecision).kind = TVar17;
  (pTVar21->timePrecision).field_0x2 = uVar18;
  (pTVar21->timePrecision).numFlags = (NumericTokenFlags)NVar19.raw;
  (pTVar21->timePrecision).rawLen = uVar20;
  (pTVar21->timePrecision).info = pIVar4;
  return pTVar21;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }